

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

uint32_t countint(cTValue *key,uint32_t *bins)

{
  double dVar1;
  uint uVar2;
  uint local_3c;
  int32_t k;
  lua_Number nk;
  uint32_t *bins_local;
  cTValue *key_local;
  
  if ((uint)((int)(key->field_4).it >> 0xf) < 0xfffffff2) {
    dVar1 = key->n;
    uVar2 = (uint)dVar1;
    if (uVar2 < 0x8000001) {
      if ((dVar1 == (double)(int)uVar2) && (!NAN(dVar1) && !NAN((double)(int)uVar2))) {
        if ((int)uVar2 < 3) {
          local_3c = 0;
        }
        else {
          local_3c = 0x1f;
          if (uVar2 - 1 != 0) {
            for (; uVar2 - 1 >> local_3c == 0; local_3c = local_3c - 1) {
            }
          }
        }
        bins[local_3c] = bins[local_3c] + 1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static uint32_t countint(cTValue *key, uint32_t *bins)
{
  lj_assertX(!tvisint(key), "bad integer key");
  if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if ((uint32_t)k < LJ_MAX_ASIZE && nk == (lua_Number)k) {
      bins[(k > 2 ? lj_fls((uint32_t)(k-1)) : 0)]++;
      return 1;
    }
  }
  return 0;
}